

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O1

doublecomplex z_sqrt(doublecomplex *z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  doublecomplex dVar4;
  
  dVar2 = z->r;
  dVar1 = z->i;
  dVar3 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar3 = dVar2 * dVar2 + dVar1 * dVar1;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar3 = (dVar3 - dVar2) * 0.5;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar2 = dVar1 / (dVar3 + dVar3);
  }
  else if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
    dVar3 = 0.0;
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar4.i = dVar3;
  dVar4.r = dVar2;
  return dVar4;
}

Assistant:

doublecomplex z_sqrt(doublecomplex *z)
{
    doublecomplex retval;
    register double cr, ci, real, imag;

    real = z->r;
    imag = z->i;

    if ( imag == 0.0 ) {
        retval.r = sqrt(real);
        retval.i = 0.0;
    } else {
        ci = (sqrt(real*real + imag*imag) - real) / 2.0;
        ci = sqrt(ci);
        cr = imag / (2.0 * ci);
        retval.r = cr;
        retval.i = ci;
    }

    return retval;
}